

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

void byte_swap(BigArrayIter *iter,size_t nmemb)

{
  undefined1 uVar1;
  void *pvVar2;
  int iVar3;
  char tmp;
  char *ptr;
  int j;
  int half;
  ptrdiff_t i;
  int elsize;
  size_t nmemb_local;
  BigArrayIter *iter_local;
  
  iVar3 = big_file_dtype_itemsize(iter->array->dtype);
  if (iVar3 != 1) {
    for (_j = 0; _j < nmemb; _j = _j + 1) {
      pvVar2 = iter->dataptr;
      for (ptr._0_4_ = 0; (int)ptr < iVar3 >> 1; ptr._0_4_ = (int)ptr + 1) {
        uVar1 = *(undefined1 *)((long)pvVar2 + (long)(int)ptr);
        *(undefined1 *)((long)pvVar2 + (long)(int)ptr) =
             *(undefined1 *)((long)pvVar2 + (long)((iVar3 - (int)ptr) + -1));
        *(undefined1 *)((long)pvVar2 + (long)((iVar3 - (int)ptr) + -1)) = uVar1;
      }
      big_array_iter_advance(iter);
    }
  }
  return;
}

Assistant:

static void
byte_swap(BigArrayIter * iter, size_t nmemb)
{
    /* swap a buffer in-place */
    int elsize = big_file_dtype_itemsize(iter->array->dtype);
    if(elsize == 1) return;
    /* need byte swap; do it now on buf2 */
    /* XXX: this may still be wrong. */
    ptrdiff_t i;
    int half = elsize >> 1;
    for(i = 0; i < nmemb; i ++) {
        int j;
        char * ptr = iter->dataptr;
        for(j = 0; j < half; j ++) {
            char tmp = ptr[j];
            ptr[j] = ptr[elsize - j - 1];
            ptr[elsize - j - 1] = tmp;
        }
        big_array_iter_advance(iter);
    }
}